

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

char * process_pref_file_expr(char **sp,char *fp)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  void *pvVar6;
  player_class *ppVar7;
  char *pcVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  byte *pbVar12;
  char *pcVar13;
  byte *__s1;
  char f;
  byte local_51;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  char **local_38;
  
  local_51 = 0x20;
  __s1 = (byte *)*sp;
  local_40 = (byte *)fp;
  local_38 = sp;
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
  do {
    pbVar12 = __s1;
    bVar9 = *pbVar12;
    uVar1 = puVar2[bVar9];
    __s1 = pbVar12 + 1;
  } while ((uVar1 >> 0xd & 1) != 0);
  if (bVar9 != 0x5b) {
    bVar10 = bVar9;
    local_48 = pbVar12;
    if ((uVar1 >> 0xe & 1) != 0) {
      uVar11 = (ulong)bVar9;
      do {
        bVar10 = (byte)uVar11;
        pvVar6 = memchr(" []",(int)(char)bVar10,4);
        if (pvVar6 != (void *)0x0) break;
        bVar10 = pbVar12[1];
        uVar11 = (ulong)bVar10;
        pbVar12 = pbVar12 + 1;
      } while ((*(byte *)((long)puVar2 + uVar11 * 2 + 1) & 0x40) != 0);
    }
    local_50 = pbVar12;
    if (bVar10 != 0) {
      local_50 = pbVar12 + 1;
      *pbVar12 = 0;
      bVar9 = *local_48;
    }
    pcVar5 = (char *)local_48;
    local_51 = bVar10;
    if ((bVar9 == 0x24) && (iVar3 = strcmp((char *)__s1,"SYS"), pcVar5 = ANGBAND_SYS, iVar3 != 0)) {
      iVar3 = strcmp((char *)__s1,"RACE");
      if (iVar3 == 0) {
        ppVar7 = (player_class *)player->race;
      }
      else {
        iVar3 = strcmp((char *)__s1,"CLASS");
        if (iVar3 != 0) {
          pcVar5 = "?o?o?";
          goto LAB_001e96e8;
        }
        ppVar7 = player->class;
      }
      pcVar5 = ppVar7->name;
    }
    goto LAB_001e96e8;
  }
  local_50 = __s1;
  pcVar5 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
  if (*pcVar5 == '\0') {
    bVar9 = *local_50;
    pcVar13 = "?o?o?";
  }
  else {
    iVar3 = strcmp(pcVar5,"IOR");
    if (iVar3 == 0) {
      bVar9 = *local_50;
      pcVar13 = "0";
      if (local_51 != 0x5d && bVar9 != 0) {
        do {
          pcVar5 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
          if (*pcVar5 != '\0') {
            if (*pcVar5 == '0') {
              if (pcVar5[1] != '\0') {
                pcVar13 = "1";
              }
            }
            else {
              pcVar13 = "1";
            }
          }
          bVar9 = *local_50;
        } while ((bVar9 != 0) && (local_51 != 0x5d));
      }
    }
    else {
      iVar3 = strcmp(pcVar5,"AND");
      if (iVar3 == 0) {
        bVar9 = *local_50;
        if (local_51 == 0x5d || bVar9 == 0) {
LAB_001e96be:
          pcVar13 = "1";
        }
        else {
          pcVar13 = "1";
          do {
            pcVar5 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
            if ((*pcVar5 == '0') && (pcVar5[1] == '\0')) {
              pcVar13 = "0";
            }
            bVar9 = *local_50;
          } while ((bVar9 != 0) && (local_51 != 0x5d));
        }
      }
      else {
        iVar3 = strcmp(pcVar5,"NOT");
        if (iVar3 == 0) {
          bVar9 = *local_50;
          if (local_51 == 0x5d || bVar9 == 0) goto LAB_001e96be;
          pcVar13 = "1";
          do {
            pcVar5 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
            if (*pcVar5 != '\0') {
              if (*pcVar5 == '0') {
                if (pcVar5[1] != '\0') {
                  pcVar13 = "0";
                }
              }
              else {
                pcVar13 = "0";
              }
            }
            bVar9 = *local_50;
          } while ((bVar9 != 0) && (local_51 != 0x5d));
        }
        else {
          iVar3 = strcmp(pcVar5,"EQU");
          if (iVar3 == 0) {
            bVar9 = *local_50;
            if (local_51 != 0x5d && bVar9 != 0) {
              pcVar5 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
              bVar9 = *local_50;
            }
            if (local_51 == 0x5d || bVar9 == 0) goto LAB_001e96be;
            pcVar13 = "1";
            do {
              pcVar8 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
              if ((*pcVar8 != '\0') && (iVar3 = strcmp(pcVar5,pcVar8), iVar3 != 0)) {
                pcVar13 = "0";
              }
              bVar9 = *local_50;
            } while ((bVar9 != 0) && (pcVar5 = pcVar8, local_51 != 0x5d));
          }
          else {
            iVar3 = strcmp(pcVar5,"LEQ");
            if (iVar3 == 0) {
              bVar9 = *local_50;
              if (local_51 != 0x5d && bVar9 != 0) {
                pcVar5 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
                bVar9 = *local_50;
              }
              if (local_51 == 0x5d || bVar9 == 0) goto LAB_001e96be;
              pcVar13 = "1";
              do {
                pcVar8 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
                if ((*pcVar8 != '\0') && (iVar3 = strcmp(pcVar5,pcVar8), -1 < iVar3)) {
                  pcVar13 = "0";
                }
                bVar9 = *local_50;
              } while ((bVar9 != 0) && (pcVar5 = pcVar8, local_51 != 0x5d));
            }
            else {
              iVar3 = strcmp(pcVar5,"GEQ");
              bVar9 = *local_50;
              if (iVar3 == 0) {
                if (local_51 != 0x5d && bVar9 != 0) {
                  pcVar5 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
                  bVar9 = *local_50;
                }
                if (local_51 == 0x5d || bVar9 == 0) goto LAB_001e96be;
                pcVar13 = "1";
                do {
                  pcVar8 = process_pref_file_expr((char **)&local_50,(char *)&local_51);
                  if ((*pcVar8 != '\0') && (iVar3 = strcmp(pcVar5,pcVar8), iVar3 < 1)) {
                    pcVar13 = "0";
                  }
                  bVar9 = *local_50;
                } while ((bVar9 != 0) && (pcVar5 = pcVar8, local_51 != 0x5d));
              }
              else {
                pcVar13 = "?o?o?";
                if (local_51 != 0x5d && bVar9 != 0) {
                  do {
                    process_pref_file_expr((char **)&local_50,(char *)&local_51);
                    bVar9 = *local_50;
                    if (bVar9 == 0) break;
                  } while (local_51 != 0x5d);
                }
              }
            }
          }
        }
      }
    }
  }
  pcVar5 = "?x?x?";
  if (local_51 == 0x5d) {
    pcVar5 = pcVar13;
  }
  local_51 = bVar9;
  if (bVar9 != 0) {
    *local_50 = 0;
    local_50 = local_50 + 1;
  }
LAB_001e96e8:
  *local_40 = local_51;
  *local_38 = (char *)local_50;
  return pcVar5;
}

Assistant:

static const char *process_pref_file_expr(char **sp, char *fp)
{
	const char *v;

	char *b;
	char *s;

	char f = ' ';

	/* Initial */
	s = (*sp);

	/* Skip spaces */
	while (isspace((unsigned char)*s)) s++;

	/* Save start */
	b = s;

	/* Default */
	v = "?o?o?";

	/* Either the string starts with a [ or it doesn't */
	if (*s == '[') {
		const char *p;
		const char *t;

		/* Skip [ */
		s++;

		/* First */
		t = process_pref_file_expr(&s, &f);

		/* Check all the different types of connective */
		if (!*t) {
			/* Nothing */
		} else if (streq(t, "IOR")) {
			v = "0";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(t, "0")) v = "1";
			}
		} else if (streq(t, "AND")) {
			v = "1";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && streq(t, "0")) v = "0";
			}
		} else if (streq(t, "NOT")) {
			v = "1";
			while (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(t, "0")) v = "0";
			}
		} else if (streq(t, "EQU")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && !streq(p, t)) v = "0";
			}
		} else if (streq(t, "LEQ")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && (strcmp(p, t) >= 0)) v = "0";
			}
		} else if (streq(t, "GEQ")) {
			v = "1";
			if (*s && (f != ']')) {
				t = process_pref_file_expr(&s, &f);
			}
			while (*s && (f != ']')) {
				p = t;
				t = process_pref_file_expr(&s, &f);
				if (*t && (strcmp(p, t) <= 0)) v = "0";
			}
		} else {
			while (*s && (f != ']')) {
				(void) process_pref_file_expr(&s, &f);
			}
		}

		/* Verify ending */
		if (f != ']') v = "?x?x?";

		/* Extract final and Terminate */
		if ((f = *s) != '\0') *s++ = '\0';
	} else {
		/* Accept all printables except spaces and brackets */
		while (isprint((unsigned char)*s) && !strchr(" []", *s)) ++s;

		/* Extract final and Terminate */
		if ((f = *s) != '\0') *s++ = '\0';

		/* Variables start with $, otherwise it's a constant */
		if (*b == '$') {
			if (streq(b+1, "SYS"))
				v = ANGBAND_SYS;
			else if (streq(b+1, "RACE"))
				v = player->race->name;
			else if (streq(b+1, "CLASS"))
				v = player->class->name;
		} else {
			v = b;
		}
	}

	/* Save */
	(*fp) = f;
	(*sp) = s;

	return v;
}